

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_base_loop(event_base *base,int flags)

{
  byte bVar1;
  undefined2 uVar2;
  event_callback *peVar3;
  event_callback **ppeVar4;
  event_callback *peVar5;
  event *peVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  unsigned_long uVar11;
  undefined8 uVar12;
  long lVar13;
  void *pvVar14;
  char *pcVar15;
  char *pcVar16;
  timeval *ptVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  timeval now;
  timeval local_68;
  timeval *local_50;
  uint local_44;
  uint local_40;
  int local_3c;
  eventop *local_38;
  
  local_38 = base->evsel;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    base->running_loop = 1;
    (base->tv_cache).tv_sec = 0;
    if (((base->sig).ev_signal_added != 0) && ((base->sig).ev_n_signals_added != 0)) {
      evsig_set_base_(base);
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      uVar11 = 1;
    }
    else {
      uVar11 = (*evthread_id_fn_)();
    }
    base->th_owner_id = uVar11;
    base->event_gotterm = 0;
    base->event_break = 0;
    local_40 = flags & 2;
    local_44 = local_40 >> 1;
    uVar10 = 0;
    while (iVar8 = 1, uVar10 == 0) {
      base->event_continue = 0;
      base->n_deferreds_queued = 0;
      if ((base->event_gotterm != 0) || (base->event_break != 0)) break;
      if (base->event_count_active == 0 && local_40 == 0) {
        if (((base->timeheap).n == 0) || (peVar6 = *(base->timeheap).p, peVar6 == (event *)0x0)) {
          ptVar17 = (timeval *)0x0;
        }
        else {
          iVar7 = gettime(base,&now);
          ptVar17 = &local_68;
          if (iVar7 != -1) {
            lVar13 = (peVar6->ev_timeout).tv_sec;
            lVar18 = lVar13 - now.tv_sec;
            if (lVar18 != 0) {
              if (lVar18 != 0 && now.tv_sec <= lVar13) {
                lVar13 = (peVar6->ev_timeout).tv_usec;
                goto LAB_001aa0f2;
              }
            }
            else {
              lVar13 = (peVar6->ev_timeout).tv_usec;
              if (now.tv_usec < lVar13) {
LAB_001aa0f2:
                lVar13 = lVar13 - now.tv_usec;
                local_68.tv_usec = lVar13;
                local_68.tv_sec = lVar18;
                if (lVar13 < 0) {
                  lVar18 = lVar18 + -1;
                  lVar13 = lVar13 + 1000000;
                  local_68.tv_usec = lVar13;
                  local_68.tv_sec = lVar18;
                }
                if (lVar18 < 0) {
                  pcVar15 = "tv->tv_sec >= 0";
                  pcVar16 = "timeout_next";
                  uVar12 = 0xc66;
                  goto LAB_001aa1ec;
                }
                if (lVar13 < 0) {
                  pcVar15 = "tv->tv_usec >= 0";
                  pcVar16 = "timeout_next";
                  uVar12 = 0xc67;
                  goto LAB_001aa1ec;
                }
                if (event_debug_logging_mask_ != 0) {
                  event_debugx_("timeout_next: event: %p, in %d seconds, %d useconds",peVar6);
                  goto LAB_001a9de2;
                }
                goto LAB_001a9e41;
              }
            }
            local_68.tv_sec = 0;
            local_68.tv_usec = 0;
          }
        }
      }
      else {
        local_68.tv_sec = 0;
        local_68.tv_usec = 0;
LAB_001a9de2:
        ptVar17 = &local_68;
      }
LAB_001a9e41:
      if (((((flags & 4U) == 0) && (base->virtual_event_count < 1)) && (base->event_count < 1)) &&
         (base->event_count_active == 0)) {
        if (event_debug_logging_mask_ == 0) goto LAB_001aa18d;
        pcVar15 = "%s: no events registered.";
        goto LAB_001aa17f;
      }
      if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
         (iVar8 = evthread_is_debug_lock_held_(base->th_base_lock), iVar8 == 0)) {
        pcVar15 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
        pcVar16 = "event_queue_make_later_events_active";
        uVar12 = 0xd75;
LAB_001aa1ec:
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,uVar12,pcVar15,pcVar16);
      }
      while (peVar5 = (base->active_later_queue).tqh_first, peVar5 != (event_callback *)0x0) {
        peVar3 = (peVar5->evcb_active_next).tqe_next;
        ppeVar4 = (peVar5->evcb_active_next).tqe_prev;
        if (peVar3 == (event_callback *)0x0) {
          peVar3 = (event_callback *)&base->active_later_queue;
        }
        (peVar3->evcb_active_next).tqe_prev = ppeVar4;
        *ppeVar4 = (peVar5->evcb_active_next).tqe_next;
        uVar2 = peVar5->evcb_flags;
        peVar5->evcb_flags = uVar2 & 0xffd7 | 8;
        bVar1 = peVar5->evcb_pri;
        if (base->nactivequeues <= (int)(uint)bVar1) {
          pcVar15 = "evcb->evcb_pri < base->nactivequeues";
          pcVar16 = "event_queue_make_later_events_active";
          uVar12 = 0xd7a;
          goto LAB_001aa1ec;
        }
        (peVar5->evcb_active_next).tqe_next = (event_callback *)0x0;
        (peVar5->evcb_active_next).tqe_prev = base->activequeues[bVar1].tqh_last;
        *base->activequeues[bVar1].tqh_last = peVar5;
        base->activequeues[peVar5->evcb_pri].tqh_last = (event_callback **)peVar5;
        base->n_deferreds_queued = base->n_deferreds_queued + (uint)(peVar5->evcb_closure == '\x03')
        ;
      }
      (base->tv_cache).tv_sec = 0;
      iVar8 = (*local_38->dispatch)(base,ptVar17);
      if (iVar8 == -1) {
        iVar8 = -1;
        if (event_debug_logging_mask_ == 0) goto LAB_001aa18d;
        pcVar15 = "%s: dispatch returned unsuccessfully.";
        goto LAB_001aa17f;
      }
      update_time_cache(base);
      if ((base->timeheap).n != 0) {
        gettime(base,&now);
        while (((base->timeheap).n != 0 && (peVar6 = *(base->timeheap).p, peVar6 != (event *)0x0)))
        {
          lVar13 = (peVar6->ev_timeout).tv_sec;
          bVar20 = SBORROW8(lVar13,now.tv_sec);
          lVar18 = lVar13 - now.tv_sec;
          bVar19 = lVar13 == now.tv_sec;
          if (bVar19) {
            lVar13 = (peVar6->ev_timeout).tv_usec;
            bVar20 = SBORROW8(lVar13,now.tv_usec);
            lVar18 = lVar13 - now.tv_usec;
            bVar19 = lVar13 == now.tv_usec;
          }
          if (!bVar19 && bVar20 == lVar18 < 0) break;
          event_del_nolock_(peVar6,0);
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("timeout_process: event: %p, call %p",peVar6,
                          (peVar6->ev_evcallback).evcb_cb_union.evcb_callback);
          }
          event_active_nolock_(peVar6,1,1);
        }
      }
      uVar10 = local_44;
      if (base->event_count_active != 0) {
        local_3c = base->max_dispatch_callbacks;
        iVar8 = base->limit_callbacks_after_prio;
        if ((base->max_dispatch_time).tv_sec < 0) {
          local_50 = (timeval *)0x0;
        }
        else {
          update_time_cache(base);
          gettime(base,&now);
          now.tv_sec = (base->max_dispatch_time).tv_sec + now.tv_sec;
          now.tv_usec = (base->max_dispatch_time).tv_usec + now.tv_usec;
          local_50 = &now;
          if (999999 < now.tv_usec) {
            now.tv_sec = now.tv_sec + 1;
            now.tv_usec = now.tv_usec + -1000000;
            local_50 = &now;
          }
        }
        lVar18 = 0;
        for (lVar13 = 0; iVar7 = base->nactivequeues, lVar13 < iVar7; lVar13 = lVar13 + 1) {
          if (*(long *)((long)&base->activequeues->tqh_first + lVar18) != 0) {
            base->event_running_priority = (int)lVar13;
            ptVar17 = local_50;
            iVar9 = local_3c;
            if (lVar13 < iVar8) {
              ptVar17 = (timeval *)0x0;
              iVar9 = 0x7fffffff;
            }
            iVar9 = event_process_active_single_queue
                              (base,(evcallback_list *)
                                    ((long)&base->activequeues->tqh_first + lVar18),iVar9,ptVar17);
            if (iVar9 != 0) break;
          }
          lVar18 = lVar18 + 0x10;
        }
        base->event_running_priority = -1;
        uVar10 = 0;
        if ((flags & 1U) != 0) {
          uVar10 = (uint)(base->event_count_active == 0 && lVar13 < iVar7);
        }
      }
    }
    iVar8 = 0;
    if (event_debug_logging_mask_ != 0) {
      pcVar15 = "%s: asked to terminate loop.";
      iVar8 = 0;
LAB_001aa17f:
      event_debugx_(pcVar15,"event_base_loop");
    }
LAB_001aa18d:
    (base->tv_cache).tv_sec = 0;
    base->running_loop = 0;
    pvVar14 = base->th_base_lock;
  }
  else {
    event_warnx("%s: reentrant invocation.  Only one event_base_loop can run on each event_base at once."
                ,"event_base_loop");
    pvVar14 = base->th_base_lock;
    iVar8 = -1;
  }
  if (pvVar14 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar14);
  }
  return iVar8;
}

Assistant:

int
event_base_loop(struct event_base *base, int flags)
{
	const struct eventop *evsel = base->evsel;
	struct timeval tv;
	struct timeval *tv_p;
	int res, done, retval = 0;

	/* Grab the lock.  We will release it inside evsel.dispatch, and again
	 * as we invoke user callbacks. */
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: reentrant invocation.  Only one event_base_loop"
		    " can run on each event_base at once.", __func__);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		return -1;
	}

	base->running_loop = 1;

	clear_time_cache(base);

	if (base->sig.ev_signal_added && base->sig.ev_n_signals_added)
		evsig_set_base_(base);

	done = 0;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	base->th_owner_id = EVTHREAD_GET_ID();
#endif

	base->event_gotterm = base->event_break = 0;

	while (!done) {
		base->event_continue = 0;
		base->n_deferreds_queued = 0;

		/* Terminate the loop if we have been asked to */
		if (base->event_gotterm) {
			break;
		}

		if (base->event_break) {
			break;
		}

		tv_p = &tv;
		if (!N_ACTIVE_CALLBACKS(base) && !(flags & EVLOOP_NONBLOCK)) {
			timeout_next(base, &tv_p);
		} else {
			/*
			 * if we have active events, we just poll new events
			 * without waiting.
			 */
			evutil_timerclear(&tv);
		}

		/* If we have no events, we just exit */
		if (0==(flags&EVLOOP_NO_EXIT_ON_EMPTY) &&
		    !event_haveevents(base) && !N_ACTIVE_CALLBACKS(base)) {
			event_debug(("%s: no events registered.", __func__));
			retval = 1;
			goto done;
		}

		event_queue_make_later_events_active(base);

		clear_time_cache(base);

		res = evsel->dispatch(base, tv_p);

		if (res == -1) {
			event_debug(("%s: dispatch returned unsuccessfully.",
				__func__));
			retval = -1;
			goto done;
		}

		update_time_cache(base);

		timeout_process(base);

		if (N_ACTIVE_CALLBACKS(base)) {
			int n = event_process_active(base);
			if ((flags & EVLOOP_ONCE)
			    && N_ACTIVE_CALLBACKS(base) == 0
			    && n != 0)
				done = 1;
		} else if (flags & EVLOOP_NONBLOCK)
			done = 1;
	}
	event_debug(("%s: asked to terminate loop.", __func__));

done:
	clear_time_cache(base);
	base->running_loop = 0;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return (retval);
}